

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Cues::LoadCuePoint(Cues *this)

{
  CuePoint *this_00;
  bool bVar1;
  long *len_00;
  longlong lVar2;
  longlong lVar3;
  Cues *this_01;
  undefined8 *in_RDI;
  CuePoint *pCP;
  longlong size;
  longlong id;
  long len;
  longlong idpos;
  IMkvReader *pReader;
  longlong stop;
  IMkvReader *in_stack_00000060;
  CuePoint *in_stack_00000068;
  long in_stack_ffffffffffffffd0;
  IMkvReader *pReader_00;
  
  this_01 = (Cues *)(in_RDI[1] + in_RDI[2]);
  if ((long)in_RDI[8] < (long)this_01) {
    bVar1 = Init(this_01);
    if (bVar1) {
      lVar3 = *(longlong *)*in_RDI;
      do {
        if ((long)this_01 <= (long)in_RDI[8]) {
          return false;
        }
        pReader_00 = (IMkvReader *)in_RDI[8];
        len_00 = (long *)ReadID((IMkvReader *)this_01,lVar3,(long *)pReader_00);
        if (((long)len_00 < 0) || ((long)this_01 < in_RDI[8] + in_stack_ffffffffffffffd0)) {
          return false;
        }
        in_RDI[8] = in_stack_ffffffffffffffd0 + in_RDI[8];
        lVar2 = ReadUInt(pReader_00,in_stack_ffffffffffffffd0,len_00);
        if ((lVar2 < 0) || ((long)this_01 < in_RDI[8] + in_stack_ffffffffffffffd0)) {
          return false;
        }
        in_RDI[8] = in_stack_ffffffffffffffd0 + in_RDI[8];
        if ((long)this_01 < in_RDI[8] + lVar2) {
          return false;
        }
        if (len_00 == (long *)0xbb) {
          if ((long)in_RDI[7] < 1) {
            return false;
          }
          this_00 = *(CuePoint **)(in_RDI[5] + in_RDI[6] * 8);
          if ((this_00 == (CuePoint *)0x0) ||
             ((lVar3 = CuePoint::GetTimeCode(this_00), lVar3 < 0 &&
              (lVar3 = CuePoint::GetTimeCode(this_00), (IMkvReader *)-lVar3 != pReader_00)))) {
            return false;
          }
          bVar1 = CuePoint::Load(in_stack_00000068,in_stack_00000060);
          if (!bVar1) {
            in_RDI[8] = this_01;
            return false;
          }
          in_RDI[6] = in_RDI[6] + 1;
          in_RDI[7] = in_RDI[7] + -1;
          in_RDI[8] = lVar2 + in_RDI[8];
          if ((long)in_RDI[8] <= (long)this_01) {
            return true;
          }
          return false;
        }
        in_RDI[8] = lVar2 + in_RDI[8];
      } while ((long)in_RDI[8] <= (long)this_01);
    }
    else {
      in_RDI[8] = this_01;
    }
  }
  return false;
}

Assistant:

bool Cues::LoadCuePoint() const {
  const long long stop = m_start + m_size;

  if (m_pos >= stop)
    return false;  // nothing else to do

  if (!Init()) {
    m_pos = stop;
    return false;
  }

  IMkvReader* const pReader = m_pSegment->m_pReader;

  while (m_pos < stop) {
    const long long idpos = m_pos;

    long len;

    const long long id = ReadID(pReader, m_pos, len);
    if (id < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume ID

    const long long size = ReadUInt(pReader, m_pos, len);
    if (size < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume Size field
    if ((m_pos + size) > stop)
      return false;

    if (id != libwebm::kMkvCuePoint) {
      m_pos += size;  // consume payload
      if (m_pos > stop)
        return false;

      continue;
    }

    if (m_preload_count < 1)
      return false;

    CuePoint* const pCP = m_cue_points[m_count];
    if (!pCP || (pCP->GetTimeCode() < 0 && (-pCP->GetTimeCode() != idpos)))
      return false;

    if (!pCP->Load(pReader)) {
      m_pos = stop;
      return false;
    }
    ++m_count;
    --m_preload_count;

    m_pos += size;  // consume payload
    if (m_pos > stop)
      return false;

    return true;  // yes, we loaded a cue point
  }

  return false;  // no, we did not load a cue point
}